

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O1

void Abc_NtkPrintGates(Abc_Ntk_t *pNtk,int fUseLibrary,int fUpdateProfile)

{
  int iVar1;
  long *plVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Mio_Gate_t **ppMVar9;
  ulong uVar10;
  Vec_Ptr_t *pVVar11;
  Abc_Obj_t *pAVar12;
  Mio_Gate_t *pMVar13;
  char *pcVar14;
  size_t sVar15;
  char *pcVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  double dVar23;
  double dVar24;
  int local_5c;
  uint local_48;
  uint local_44;
  
  if ((fUseLibrary != 0) && (pNtk->ntkFunc == ABC_FUNC_MAP)) {
    uVar3 = Mio_LibraryReadGateNum((Mio_Library_t *)pNtk->pManFunc);
    ppMVar9 = Mio_LibraryReadGateArray((Mio_Library_t *)pNtk->pManFunc);
    uVar10 = (ulong)uVar3;
    if (0 < (int)uVar3) {
      uVar20 = 0;
      do {
        Mio_GateSetValue(ppMVar9[uVar20],0);
        if (fUpdateProfile != 0) {
          Mio_GateSetProfile2(ppMVar9[uVar20],0);
        }
        uVar20 = uVar20 + 1;
      } while (uVar10 != uVar20);
    }
    pVVar11 = pNtk->vObjs;
    if (pVVar11->nSize < 1) {
      local_48 = 0;
    }
    else {
      uVar20 = 0;
      local_48 = 0;
      do {
        iVar18 = (int)uVar20;
        if (iVar18 < 0) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar12 = (Abc_Obj_t *)pVVar11->pArray[uVar20];
        if ((pAVar12 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar12->field_0x14 & 0xf) == 7)) {
          bVar21 = false;
          if (pAVar12->pNtk->ntkFunc == ABC_FUNC_MAP) {
            if ((pAVar12->vFanins).nSize == 1) {
              bVar21 = (pAVar12->field_5).pData == (void *)0x0;
            }
            else {
              bVar21 = false;
            }
          }
          if ((iVar18 != 0) && (!bVar21)) {
            pMVar13 = (Mio_Gate_t *)(pAVar12->field_5).pData;
            iVar4 = Mio_GateReadValue(pMVar13);
            Mio_GateSetValue(pMVar13,iVar4 + 1);
            if (fUpdateProfile != 0) {
              Mio_GateIncProfile2((Mio_Gate_t *)(pAVar12->field_5).pData);
            }
            local_48 = local_48 + 1;
            pAVar12 = Abc_NtkFetchTwinNode(pAVar12);
            iVar18 = (iVar18 + 1) - (uint)(pAVar12 == (Abc_Obj_t *)0x0);
          }
        }
        uVar20 = (ulong)(iVar18 + 1U);
        pVVar11 = pNtk->vObjs;
      } while ((int)(iVar18 + 1U) < pVVar11->nSize);
    }
    uVar19 = 5;
    if (0 < (int)uVar3) {
      uVar20 = 0;
      do {
        iVar18 = Mio_GateReadValue(ppMVar9[uVar20]);
        uVar6 = uVar19;
        if (iVar18 != 0) {
          pcVar14 = Mio_GateReadName(ppMVar9[uVar20]);
          sVar15 = strlen(pcVar14);
          uVar6 = (uint)sVar15;
          if ((int)(uint)sVar15 < (int)uVar19) {
            uVar6 = uVar19;
          }
        }
        uVar19 = uVar6;
        uVar20 = uVar20 + 1;
      } while (uVar10 != uVar20);
    }
    dVar23 = Abc_NtkGetMappedArea(pNtk);
    if ((int)uVar3 < 1) {
      local_44 = 0;
    }
    else {
      uVar20 = 0;
      local_44 = 0;
      do {
        uVar3 = Mio_GateReadValue(ppMVar9[uVar20]);
        if ((uVar3 != 0) || (iVar18 = Mio_GateReadProfile(ppMVar9[uVar20]), iVar18 != 0)) {
          iVar18 = Mio_GateReadPinNum(ppMVar9[uVar20]);
          if (1 < iVar18) {
            iVar4 = Mio_GateReadProfile(ppMVar9[uVar20]);
            iVar18 = Mio_GateReadProfile2(ppMVar9[uVar20]);
            iVar4 = iVar4 - iVar18;
            iVar18 = -iVar4;
            if (0 < iVar4) {
              iVar18 = iVar4;
            }
            local_44 = local_44 + iVar18;
          }
          dVar24 = Mio_GateReadArea(ppMVar9[uVar20]);
          pcVar14 = Mio_GateReadName(ppMVar9[uVar20]);
          uVar6 = Mio_GateReadPinNum(ppMVar9[uVar20]);
          uVar7 = Mio_GateReadProfile(ppMVar9[uVar20]);
          uVar8 = Mio_GateReadProfile2(ppMVar9[uVar20]);
          pcVar16 = Mio_GateReadForm(ppMVar9[uVar20]);
          printf("%-*s   Fanin = %2d   Instance = %8d   Area = %10.2f   %6.2f %%   %8d  %8d   %s\n",
                 dVar24 * (double)(int)uVar3,(dVar24 * (double)(int)uVar3 * 100.0) / dVar23,
                 (ulong)uVar19,pcVar14,(ulong)uVar6,(ulong)uVar3,(ulong)uVar7,(ulong)uVar8,pcVar16);
        }
        uVar20 = uVar20 + 1;
      } while (uVar10 != uVar20);
    }
    printf("%-*s                Instance = %8d   Area = %10.2f   %6.2f %%   AbsDiff = %d\n",dVar23,
           0x4059000000000000,(ulong)uVar19,"TOTAL",(ulong)local_48,(ulong)local_44);
    return;
  }
  if (pNtk->ntkFunc == ABC_FUNC_BDD) {
    bVar21 = pNtk->ntkType != ABC_NTK_LOGIC;
  }
  else {
    bVar21 = true;
    if ((pNtk->ntkFunc == ABC_FUNC_AIG) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
      return;
    }
  }
  if ((!bVar21) && (iVar18 = Abc_NtkBddToSop(pNtk,-1,1000000000), iVar18 == 0)) {
    puts("Abc_NtkPrintGates(): Converting to SOPs has failed.");
    return;
  }
  pVVar11 = pNtk->vObjs;
  if (pVVar11->nSize < 1) {
    iVar18 = 0;
    iVar4 = 0;
    iVar1 = 0;
    local_5c = 0;
    uVar3 = 0;
    uVar19 = 0;
    uVar6 = 0;
  }
  else {
    lVar17 = 0;
    uVar6 = 0;
    uVar19 = 0;
    uVar3 = 0;
    local_5c = 0;
    iVar1 = 0;
    iVar4 = 0;
    iVar18 = 0;
    do {
      plVar2 = (long *)pVVar11->pArray[lVar17];
      if ((plVar2 != (long *)0x0) && ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 7)) {
        bVar22 = false;
        if (*(int *)(*plVar2 + 4) == 4) {
          if (*(int *)((long)plVar2 + 0x1c) == 1) {
            bVar22 = plVar2[7] == 0;
          }
          else {
            bVar22 = false;
          }
        }
        if ((lVar17 != 0) && (!bVar22)) {
          pMVar13 = (Mio_Gate_t *)plVar2[7];
          if (pNtk->ntkFunc == ABC_FUNC_MAP) {
            pMVar13 = (Mio_Gate_t *)Mio_GateReadSop(pMVar13);
          }
          iVar5 = Abc_SopIsConst0((char *)pMVar13);
          if ((iVar5 == 0) && (iVar5 = Abc_SopIsConst1((char *)pMVar13), iVar5 == 0)) {
            iVar5 = Abc_SopIsBuf((char *)pMVar13);
            if (iVar5 == 0) {
              iVar5 = Abc_SopIsInv((char *)pMVar13);
              if (iVar5 == 0) {
                iVar5 = Abc_SopIsComplement((char *)pMVar13);
                if (((iVar5 == 0) && (iVar5 = Abc_SopIsAndType((char *)pMVar13), iVar5 != 0)) ||
                   ((iVar5 = Abc_SopIsComplement((char *)pMVar13), iVar5 != 0 &&
                    (iVar5 = Abc_SopIsOrType((char *)pMVar13), iVar5 != 0)))) {
                  iVar4 = iVar4 + 1;
                }
                else {
                  iVar5 = Abc_SopIsComplement((char *)pMVar13);
                  if (((iVar5 == 0) || (iVar5 = Abc_SopIsAndType((char *)pMVar13), iVar5 == 0)) &&
                     ((iVar5 = Abc_SopIsComplement((char *)pMVar13), iVar5 != 0 ||
                      (iVar5 = Abc_SopIsOrType((char *)pMVar13), iVar5 == 0)))) {
                    local_5c = local_5c + 1;
                  }
                  else {
                    iVar1 = iVar1 + 1;
                  }
                }
              }
              else {
                iVar18 = iVar18 + 1;
              }
            }
            else {
              uVar19 = uVar19 + 1;
            }
          }
          else {
            uVar6 = uVar6 + 1;
          }
          uVar3 = uVar3 + 1;
        }
      }
      lVar17 = lVar17 + 1;
      pVVar11 = pNtk->vObjs;
    } while (lVar17 < pVVar11->nSize);
  }
  dVar23 = (double)(int)uVar3;
  printf("Const        = %8d    %6.2f %%\n",((double)(int)uVar6 * 100.0) / dVar23,(ulong)uVar6);
  printf("Buffer       = %8d    %6.2f %%\n",((double)(int)uVar19 * 100.0) / dVar23,(ulong)uVar19);
  printf("Inverter     = %8d    %6.2f %%\n",((double)iVar18 * 100.0) / dVar23);
  printf("And          = %8d    %6.2f %%\n",((double)iVar4 * 100.0) / dVar23);
  printf("Or           = %8d    %6.2f %%\n",((double)iVar1 * 100.0) / dVar23);
  printf("Other        = %8d    %6.2f %%\n",((double)local_5c * 100.0) / dVar23);
  printf("TOTAL        = %8d    %6.2f %%\n",(dVar23 * 100.0) / dVar23,(ulong)uVar3);
  if (bVar21) {
    return;
  }
  Abc_NtkSopToBdd(pNtk);
  return;
}

Assistant:

void Abc_NtkPrintGates( Abc_Ntk_t * pNtk, int fUseLibrary, int fUpdateProfile )
{
    Abc_Obj_t * pObj;
    int fHasBdds, i;
    int CountConst, CountBuf, CountInv, CountAnd, CountOr, CountOther, CounterTotal, TotalDiff = 0;
    char * pSop;

    if ( fUseLibrary && Abc_NtkHasMapping(pNtk) )
    {
        Mio_Gate_t ** ppGates;
        double Area, AreaTotal;
        int Counter, nGates, i, nGateNameLen;

        // clean value of all gates
        nGates = Mio_LibraryReadGateNum( (Mio_Library_t *)pNtk->pManFunc );
        ppGates = Mio_LibraryReadGateArray( (Mio_Library_t *)pNtk->pManFunc );
        for ( i = 0; i < nGates; i++ )
        {
            Mio_GateSetValue( ppGates[i], 0 );
            if ( fUpdateProfile )
                Mio_GateSetProfile2( ppGates[i], 0 );
        }

        // count the gates by name
        CounterTotal = 0;
        Abc_NtkForEachNodeNotBarBuf( pNtk, pObj, i )
        {
            if ( i == 0 ) continue;
            Mio_GateSetValue( (Mio_Gate_t *)pObj->pData, 1 + Mio_GateReadValue((Mio_Gate_t *)pObj->pData) );
            if ( fUpdateProfile )
                Mio_GateIncProfile2( (Mio_Gate_t *)pObj->pData );
            CounterTotal++;
            // assuming that twin gates follow each other
            if ( Abc_NtkFetchTwinNode(pObj) )
                i++;
        }

        // determine the longest gate name
        nGateNameLen = 5;
        for ( i = 0; i < nGates; i++ )
        {
            Counter = Mio_GateReadValue( ppGates[i] );
            if ( Counter == 0 )
                continue;
            nGateNameLen = Abc_MaxInt( nGateNameLen, strlen(Mio_GateReadName(ppGates[i])) );
        }

        // print the gates
        AreaTotal = Abc_NtkGetMappedArea(pNtk);
        for ( i = 0; i < nGates; i++ )
        {
            Counter = Mio_GateReadValue( ppGates[i] );
            if ( Counter == 0 && Mio_GateReadProfile(ppGates[i]) == 0 )
                continue;
            if ( Mio_GateReadPinNum(ppGates[i]) > 1 )
                TotalDiff += Abc_AbsInt( Mio_GateReadProfile(ppGates[i]) - Mio_GateReadProfile2(ppGates[i]) );
            Area = Counter * Mio_GateReadArea( ppGates[i] );
            printf( "%-*s   Fanin = %2d   Instance = %8d   Area = %10.2f   %6.2f %%   %8d  %8d   %s\n",
                nGateNameLen, Mio_GateReadName( ppGates[i] ),
                Mio_GateReadPinNum( ppGates[i] ),
                Counter, Area, 100.0 * Area / AreaTotal,
                Mio_GateReadProfile(ppGates[i]),
                Mio_GateReadProfile2(ppGates[i]),
                Mio_GateReadForm(ppGates[i]) );
        }
        printf( "%-*s                Instance = %8d   Area = %10.2f   %6.2f %%   AbsDiff = %d\n",
            nGateNameLen, "TOTAL",
            CounterTotal, AreaTotal, 100.0, TotalDiff );
        return;
    }

    if ( Abc_NtkIsAigLogic(pNtk) )
        return;

    // transform logic functions from BDD to SOP
    if ( (fHasBdds = Abc_NtkIsBddLogic(pNtk)) )
    {
        if ( !Abc_NtkBddToSop(pNtk, -1, ABC_INFINITY) )
        {
            printf( "Abc_NtkPrintGates(): Converting to SOPs has failed.\n" );
            return;
        }
    }

    // get hold of the SOP of the node
    CountConst = CountBuf = CountInv = CountAnd = CountOr = CountOther = CounterTotal = 0;
    Abc_NtkForEachNodeNotBarBuf( pNtk, pObj, i )
    {
        if ( i == 0 ) continue;
        if ( Abc_NtkHasMapping(pNtk) )
            pSop = Mio_GateReadSop((Mio_Gate_t *)pObj->pData);
        else
            pSop = (char *)pObj->pData;
        // collect the stats
        if ( Abc_SopIsConst0(pSop) || Abc_SopIsConst1(pSop) )
            CountConst++;
        else if ( Abc_SopIsBuf(pSop) )
            CountBuf++;
        else if ( Abc_SopIsInv(pSop) )
            CountInv++;
        else if ( (!Abc_SopIsComplement(pSop) && Abc_SopIsAndType(pSop)) ||
                  ( Abc_SopIsComplement(pSop) && Abc_SopIsOrType(pSop)) )
            CountAnd++;
        else if ( ( Abc_SopIsComplement(pSop) && Abc_SopIsAndType(pSop)) ||
                  (!Abc_SopIsComplement(pSop) && Abc_SopIsOrType(pSop)) )
            CountOr++;
        else
            CountOther++;
        CounterTotal++;
    }
    printf( "Const        = %8d    %6.2f %%\n", CountConst  ,  100.0 * CountConst   / CounterTotal );
    printf( "Buffer       = %8d    %6.2f %%\n", CountBuf    ,  100.0 * CountBuf     / CounterTotal );
    printf( "Inverter     = %8d    %6.2f %%\n", CountInv    ,  100.0 * CountInv     / CounterTotal );
    printf( "And          = %8d    %6.2f %%\n", CountAnd    ,  100.0 * CountAnd     / CounterTotal );
    printf( "Or           = %8d    %6.2f %%\n", CountOr     ,  100.0 * CountOr      / CounterTotal );
    printf( "Other        = %8d    %6.2f %%\n", CountOther  ,  100.0 * CountOther   / CounterTotal );
    printf( "TOTAL        = %8d    %6.2f %%\n", CounterTotal,  100.0 * CounterTotal / CounterTotal );

    // convert the network back into BDDs if this is how it was
    if ( fHasBdds )
        Abc_NtkSopToBdd(pNtk);
}